

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall r_comp::Compiler::read_sys_object(Compiler *this,Ptr *node,Ptr *view)

{
  Metadata *pMVar1;
  Image *this_00;
  ImageObject *object;
  bool bVar2;
  char cVar3;
  byte bVar4;
  element_type *peVar5;
  size_type sVar6;
  size_type sVar7;
  pointer ppVar8;
  SysObject *this_01;
  size_t i;
  mapped_type *this_02;
  Atom *this_03;
  reference psVar9;
  SysView *this_04;
  string local_418 [32];
  string local_3f8 [8];
  string label;
  shared_ptr<r_comp::RepliStruct> local_3d8;
  allocator local_3c1;
  string local_3c0 [36];
  int local_39c;
  shared_ptr<r_comp::RepliStruct> local_398;
  allocator local_381;
  string local_380 [32];
  shared_ptr<r_comp::RepliStruct> local_360;
  uint16_t local_34a;
  undefined1 local_348 [6];
  uint16_t extent_index_1;
  Ptr argNode;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range2;
  string local_318 [4];
  uint16_t count;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_298;
  shared_ptr<r_comp::RepliStruct> local_290;
  string local_280 [32];
  ImageObject *local_260;
  SysObject *sys_object;
  uint16_t local_242;
  undefined1 local_240 [6];
  uint16_t extent_index;
  Reference local_1f8;
  key_type local_160 [8];
  string label_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_140;
  shared_ptr<r_comp::RepliStruct> local_138;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  shared_ptr<r_comp::RepliStruct> local_e8;
  allocator local_d1;
  string local_d0 [32];
  shared_ptr<r_comp::RepliStruct> local_b0;
  allocator local_99;
  string local_98 [39];
  byte local_71;
  undefined1 local_70 [7];
  bool hasLabel;
  allocator local_49;
  string local_48 [32];
  Ptr *local_28;
  Ptr *view_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_28 = view;
  view_local = node;
  node_local = (Ptr *)this;
  peVar5 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  if (peVar5->type == Structure) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
    ::clear(&this->local_references);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->hlp_references);
    peVar5 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    local_71 = std::operator!=(&peVar5->label,"");
    this->in_hlp = false;
    peVar5 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    sVar6 = std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::size(&peVar5->args);
    if (sVar6 == 0) {
      if ((local_71 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"error: missing expression opening",&local_d1);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e8,node);
        set_error(this,(string *)local_d0,&local_e8);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e8);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"error: label not followed by expression",&local_99);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_b0,node);
        set_error(this,(string *)local_98,&local_b0);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_b0);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
      this_local._7_1_ = 0;
    }
    else {
      pMVar1 = this->_metadata;
      peVar5 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      sVar7 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
              ::count(&pMVar1->classes,&peVar5->cmd);
      if (sVar7 == 0) {
        std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)node);
        std::operator+((char *)local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "error: unknown class \'");
        std::operator+(local_108,(char *)local_128);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_138,node);
        set_error(this,local_108,&local_138);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_138);
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::~string(local_128);
        this_local._7_1_ = 0;
      }
      else {
        pMVar1 = this->_metadata;
        peVar5 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)node);
        local_140._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
             ::find(&pMVar1->classes,&peVar5->cmd);
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                               *)&local_140);
        Class::operator=(&this->current_class,&ppVar8->second);
        bVar2 = std::operator==(&(this->current_class).str_opcode,"mdl");
        if ((bVar2) || (bVar2 = std::operator==(&(this->current_class).str_opcode,"cst"), bVar2)) {
          this->in_hlp = true;
        }
        this_01 = (SysObject *)operator_new(0x70);
        r_code::SysObject::SysObject(this_01);
        this->current_object = (ImageObject *)this_01;
        if ((local_71 & 1) != 0) {
          peVar5 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)node);
          std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)node);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_160,(ulong)&peVar5->label);
          i = r_code::vector<r_code::SysObject_*>::size(&(this->_image->code_segment).objects);
          Class::Class((Class *)local_240,ANY);
          Reference::Reference(&local_1f8,i,&this->current_class,(Class *)local_240);
          this_02 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
                    ::operator[](&this->_metadata->global_references,local_160);
          Reference::operator=(this_02,&local_1f8);
          Reference::~Reference(&local_1f8);
          Class::~Class((Class *)local_240);
          std::__cxx11::string::~string((string *)local_160);
        }
        this_03 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),0);
        r_code::Atom::operator=(this_03,&(this->current_class).atom);
        cVar3 = r_code::Atom::getAtomCount();
        if (cVar3 != '\0') {
          bVar4 = r_code::Atom::getAtomCount();
          local_242 = bVar4 + 1;
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)&sys_object,node);
          bVar2 = expression_tail(this,(shared_ptr<r_comp::RepliStruct> *)&sys_object,
                                  &this->current_class,1,&local_242,true);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)&sys_object);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            this_local._7_1_ = 0;
            goto LAB_0019385e;
          }
        }
        local_260 = this->current_object;
        peVar5 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)view);
        sVar6 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::size(&peVar5->args);
        if (sVar6 == 0) {
          peVar5 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)view);
          if (peVar5->type != Atom) {
            peVar5 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)view);
            bVar2 = std::operator!=(&peVar5->cmd,"|[]");
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3c0,"expected a view set",&local_3c1);
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_3d8,view);
              set_error(this,(string *)local_3c0,&local_3d8);
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_3d8);
              std::__cxx11::string::~string(local_3c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
              this_local._7_1_ = 0;
              goto LAB_0019385e;
            }
          }
        }
        else {
          peVar5 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)view);
          if (peVar5->type != Set) {
            std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)view);
            std::operator+((char *)local_280,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "expected a view set, got ");
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_290,view);
            set_error(this,local_280,&local_290);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_290);
            std::__cxx11::string::~string((string *)local_280);
            this_local._7_1_ = 0;
            goto LAB_0019385e;
          }
          bVar2 = std::operator==(&(this->current_class).str_opcode,"grp");
          if (bVar2) {
            pMVar1 = this->_metadata;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2b8,"grp_view",&local_2b9);
            local_298._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                 ::find(&pMVar1->classes,(key_type *)local_2b8);
            ppVar8 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                                   *)&local_298);
            Class::operator=(&this->current_class,&ppVar8->second);
            std::__cxx11::string::~string(local_2b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          }
          else {
            bVar2 = std::operator==(&(this->current_class).str_opcode,"ipgm");
            if ((((bVar2) ||
                 (bVar2 = std::operator==(&(this->current_class).str_opcode,"icpp_pgm"), bVar2)) ||
                (bVar2 = std::operator==(&(this->current_class).str_opcode,"mdl"), bVar2)) ||
               (bVar2 = std::operator==(&(this->current_class).str_opcode,"cst"), bVar2)) {
              pMVar1 = this->_metadata;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2e8,"pgm_view",&local_2e9);
              local_2c8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                   ::find(&pMVar1->classes,(key_type *)local_2e8);
              ppVar8 = std::__detail::
                       _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                       ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                                     *)&local_2c8);
              Class::operator=(&this->current_class,&ppVar8->second);
              std::__cxx11::string::~string(local_2e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
            }
            else {
              pMVar1 = this->_metadata;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_318,"view",(allocator *)((long)&__range2 + 7));
              local_2f8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                   ::find(&pMVar1->classes,(key_type *)local_318);
              ppVar8 = std::__detail::
                       _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                       ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                                     *)&local_2f8);
              Class::operator=(&this->current_class,&ppVar8->second);
              std::__cxx11::string::~string(local_318);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
            }
          }
          (this->current_class).use_as = I_CLASS;
          __range2._4_2_ = 0;
          peVar5 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)view);
          __end2 = std::
                   vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   ::begin(&peVar5->args);
          argNode.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  std::
                  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  ::end(&peVar5->args);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                             *)&argNode.
                                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount), bVar2) {
            psVar9 = __gnu_cxx::
                     __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                     ::operator*(&__end2);
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                      ((shared_ptr<r_comp::RepliStruct> *)local_348,psVar9);
            this_04 = (SysView *)operator_new(0x38);
            r_code::SysView::SysView(this_04);
            this->current_object = (ImageObject *)this_04;
            local_34a = 0;
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                      (&local_360,(shared_ptr<r_comp::RepliStruct> *)local_348);
            bVar2 = read_set(this,&local_360,true,&this->current_class,0,&local_34a,true);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_360);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              __range2._4_2_ = __range2._4_2_ + 1;
              r_code::vector<r_code::SysView_*>::push_back
                        ((vector<r_code::SysView_*> *)(local_260 + 0x50),
                         (SysView *)this->current_object);
              local_39c = 0;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_380," error: illegal element in set",&local_381);
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                        (&local_398,(shared_ptr<r_comp::RepliStruct> *)local_348);
              set_error(this,(string *)local_380,&local_398);
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_398);
              std::__cxx11::string::~string(local_380);
              std::allocator<char>::~allocator((allocator<char> *)&local_381);
              if (this->current_object != (ImageObject *)0x0) {
                (**(code **)(*(long *)this->current_object + 8))();
              }
              this_local._7_1_ = 0;
              local_39c = 1;
            }
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                      ((shared_ptr<r_comp::RepliStruct> *)local_348);
            if (local_39c != 0) goto LAB_0019385e;
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
            ::operator++(&__end2);
          }
        }
        if ((this->trace & 1U) != 0) {
          (**(code **)(*(long *)local_260 + 0x20))();
        }
        peVar5 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)node);
        std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)node);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_3f8,(ulong)&peVar5->label);
        object = local_260;
        this_00 = this->_image;
        std::__cxx11::string::string(local_418,local_3f8);
        Image::add_sys_object(this_00,(SysObject *)object,(string *)local_418);
        std::__cxx11::string::~string(local_418);
        this_local._7_1_ = 1;
        local_39c = 1;
        std::__cxx11::string::~string(local_3f8);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"expected expression",&local_49);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_70,node);
    set_error(this,(string *)local_48,(shared_ptr<r_comp::RepliStruct> *)local_70);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_70);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
LAB_0019385e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::read_sys_object(RepliStruct::Ptr node, RepliStruct::Ptr view)
{
    if (node->type != RepliStruct::Structure) {
        set_error("expected expression", node);
        return false;
    }

    local_references.clear();
    hlp_references.clear();
    bool hasLabel = node->label != "";
    in_hlp = false;

    if (node->args.size() == 0) {
        if (hasLabel) {
            set_error("error: label not followed by expression", node);
        } else {
            set_error("error: missing expression opening", node);
        }

        return false;
    }

    if (_metadata->classes.count(node->cmd) == 0) {
        set_error("error: unknown class '" + node->cmd + "'", node);
        return false;
    }

    current_class = _metadata->classes.find(node->cmd)->second;

    if (current_class.str_opcode == "mdl" || current_class.str_opcode == "cst") {
        in_hlp = true;
    }

    current_object = new SysObject();

    if (hasLabel) {
        std::string label = node->label.substr(0, node->label.size() - 1);
        _metadata->global_references[label] = Reference(_image->code_segment.objects.size(), current_class, Class());
    }

    current_object->code[0] = current_class.atom;

    if (current_class.atom.getAtomCount()) {
        uint16_t extent_index = current_class.atom.getAtomCount() + 1;

        if (!expression_tail(node, current_class, 1, extent_index, true)) {
            return false;
        }
    }

    SysObject *sys_object = (SysObject *)current_object; // current_object will point to views, if any.

    // compile view set
    // input format:
    // []
    // [view-data]
    // ...
    // [view-data]
    // or:
    // |[]

    if (view->args.size() > 0) {
        if (view->type != RepliStruct::Set) {
            set_error("expected a view set, got " + view->cmd, view);
            return false;
        }

        if (current_class.str_opcode == "grp") {
            current_class = _metadata->classes.find("grp_view")->second;
        } else if (current_class.str_opcode == "ipgm" ||
                   current_class.str_opcode == "icpp_pgm" ||
                   current_class.str_opcode == "mdl" ||
                   current_class.str_opcode == "cst") {
            current_class = _metadata->classes.find("pgm_view")->second;
        } else {
            current_class = _metadata->classes.find("view")->second;
        }

        current_class.use_as = StructureMember::I_CLASS;
        uint16_t count = 0;

        for (RepliStruct::Ptr argNode : view->args) {
            current_object = new SysView();
            uint16_t extent_index = 0;

            if (!read_set(argNode, true, &current_class, 0, extent_index, true)) {
                set_error(" error: illegal element in set", argNode);
                delete current_object;
                return false;
            }

            count++;
            sys_object->views.push_back((SysView *)current_object);
        }
    } else if (view->type != RepliStruct::Atom && view->cmd != "|[]") {
        set_error("expected a view set", view);
        return false;
    }

    if (trace) {
        sys_object->trace();
    }

    // TODO: what happens if hasLabel == false
    std::string label = node->label.substr(0, node->label.size() - 1);
    _image->add_sys_object(sys_object, label);
    return true;
}